

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ComputeShaderBase(ComputeShaderBase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  PixelFormat *pPVar3;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  undefined8 local_60;
  undefined8 local_58;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  undefined8 local_30;
  undefined8 local_28;
  float local_20;
  float epsilon_zero;
  ComputeShaderBase *local_10;
  ComputeShaderBase *this_local;
  
  local_10 = this;
  deqp::SubcaseBase::SubcaseBase(&this->super_SubcaseBase);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__ComputeShaderBase_0323cb28;
  pRVar2 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[4])();
  this->renderTarget = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  pPVar3 = tcu::RenderTarget::getPixelFormat(this->renderTarget);
  this->pixelFormat = pPVar3;
  tcu::Vector<float,_4>::Vector(&this->g_color_eps);
  local_20 = 0.00012207031;
  if ((((this->pixelFormat->redBits == 0) || (this->pixelFormat->greenBits == 0)) ||
      (this->pixelFormat->blueBits == 0)) || (this->pixelFormat->alphaBits == 0)) {
    if (((this->pixelFormat->redBits == 0) || (this->pixelFormat->greenBits == 0)) ||
       (this->pixelFormat->blueBits == 0)) {
      tcu::Vector<float,_4>::Vector(&local_90,0.00012207031);
      *(undefined8 *)(this->g_color_eps).m_data = local_90.m_data._0_8_;
      *(undefined8 *)((this->g_color_eps).m_data + 2) = local_90.m_data._8_8_;
    }
    else {
      pPVar3 = this->pixelFormat;
      tcu::Vector<float,_4>::Vector
                (&local_70,1.0 / ((float)(1 << ((byte)pPVar3->redBits & 0x1f)) - 1.0),
                 1.0 / ((float)(1 << ((byte)pPVar3->greenBits & 0x1f)) - 1.0),
                 1.0 / ((float)(1 << ((byte)pPVar3->blueBits & 0x1f)) - 1.0),1.0);
      tcu::Vector<float,_4>::Vector(&local_80,local_20);
      tcu::operator+((tcu *)&local_60,&local_70,&local_80);
      *(undefined8 *)(this->g_color_eps).m_data = local_60;
      *(undefined8 *)((this->g_color_eps).m_data + 2) = local_58;
    }
  }
  else {
    pPVar3 = this->pixelFormat;
    tcu::Vector<float,_4>::Vector
              (&local_40,1.0 / ((float)(1 << ((byte)pPVar3->redBits & 0x1f)) - 1.0),
               1.0 / ((float)(1 << ((byte)pPVar3->greenBits & 0x1f)) - 1.0),
               1.0 / ((float)(1 << ((byte)pPVar3->blueBits & 0x1f)) - 1.0),
               1.0 / ((float)(1 << ((byte)pPVar3->alphaBits & 0x1f)) - 1.0));
    tcu::Vector<float,_4>::Vector(&local_50,local_20);
    tcu::operator+((tcu *)&local_30,&local_40,&local_50);
    *(undefined8 *)(this->g_color_eps).m_data = local_30;
    *(undefined8 *)((this->g_color_eps).m_data + 2) = local_28;
  }
  return;
}

Assistant:

ComputeShaderBase()
		: renderTarget(m_context.getRenderContext().getRenderTarget()), pixelFormat(renderTarget.getPixelFormat())
	{
		float epsilon_zero = 1.f / (1 << 13);
		if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0 &&
			pixelFormat.alphaBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.alphaBits) - 1.0f)) +
						  vec4(epsilon_zero);
		}
		else if (pixelFormat.redBits != 0 && pixelFormat.greenBits != 0 && pixelFormat.blueBits != 0)
		{
			g_color_eps = vec4(1.f / ((float)(1 << pixelFormat.redBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.greenBits) - 1.0f),
							   1.f / ((float)(1 << pixelFormat.blueBits) - 1.0f), 1.f) +
						  vec4(epsilon_zero);
		}
		else
		{
			g_color_eps = vec4(epsilon_zero);
		}
	}